

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_convert_tile_tbyte
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  void *__src;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  if ((((zbitpix != 8) || (scale != 1.0)) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
    *status = 0x19d;
    iVar4 = 0x19d;
  }
  else {
    uVar9 = (ulong)(uint)outfptr->Fptr->compress_type;
    if ((uVar9 < 0x34) && ((0x8000000600800U >> (uVar9 & 0x3f) & 1) != 0)) {
      *intlength = 1;
      if ((nullcheck == 1) && (bVar1 = *nullflagval, 0 < tilelen && (uint)bVar1 != nullval)) {
        uVar9 = tilelen + 1;
        do {
          if (*(byte *)((long)tiledata + (uVar9 - 2)) == bVar1) {
            *(char *)((long)tiledata + (uVar9 - 2)) = (char)nullval;
          }
          uVar9 = uVar9 - 1;
        } while (1 < uVar9);
      }
    }
    else {
      *intlength = 4;
      if (nullcheck == 1) {
        if (0 < tilelen) {
          bVar1 = *nullflagval;
          uVar9 = tilelen + 1;
          do {
            bVar2 = *(byte *)((long)tiledata + (uVar9 - 2));
            uVar5 = (uint)bVar2;
            if (bVar2 == bVar1) {
              uVar5 = nullval;
            }
            *(uint *)((long)tiledata + uVar9 * 4 + -8) = uVar5;
            uVar9 = uVar9 - 1;
          } while (1 < uVar9);
        }
      }
      else if (*status < 1) {
        lVar8 = 10000;
        if (tilelen < 10000) {
          lVar8 = tilelen;
        }
        __src = malloc(lVar8 * 4);
        if (__src == (void *)0x0) {
          ffpmsg("Out of memory. (fits_ubyte_to_int_inplace)");
          *status = 0x71;
        }
        else {
          if (0 < tilelen) {
            lVar10 = tilelen - lVar8;
            do {
              lVar6 = 1;
              if (1 < lVar8) {
                lVar6 = lVar8;
              }
              lVar7 = 0;
              do {
                *(uint *)((long)__src + lVar7 * 4) =
                     (uint)*(byte *)((long)tiledata + lVar7 + lVar10);
                lVar7 = lVar7 + 1;
              } while (lVar6 != lVar7);
              memcpy((void *)((long)tiledata + lVar10 * 4),__src,lVar8 * 4);
              if (lVar10 < 0x2711) {
                lVar8 = lVar10;
              }
              bVar3 = lVar10 < 0x2711;
              lVar10 = lVar10 + -10000;
              if (bVar3) {
                lVar10 = 0;
              }
            } while (0 < lVar8);
          }
          free(__src);
        }
      }
    }
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int imcomp_convert_tile_tbyte(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input unsigned integer*1 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int flagval, *idata;
    long ii;
    unsigned char *usbbuff;
        
       /* datatype of input array is unsigned byte.  We only support writing this datatype
          to a FITS image with BITPIX = 8 and with BZERO = 0 and BSCALE = 1.  */

       if (zbitpix != BYTE_IMG || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       idata = (int *) tiledata;
       usbbuff = (unsigned char *) tiledata;

       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2, or Rice compression */
           *intlength = 1;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(unsigned char *) (nullflagval);
               if (flagval != nullval) {
                  for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbbuff[ii] == (unsigned char) flagval)
		       usbbuff[ii] = (unsigned char) nullval;
                    }
               }
           }
       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(unsigned char *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbbuff[ii] == (unsigned char) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = (int) usbbuff[ii];
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert usbbuff to an I*4 array, in place */
                 /* usbbuff must have been allocated large enough to do this */
                 fits_ubyte_to_int_inplace(usbbuff, tilelen, status);
           }
       }

       return(*status);
}